

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_grandfather.cpp
# Opt level: O1

void solve(unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           *d)

{
  __buckets_ptr pp_Var1;
  ulong uVar2;
  istream *piVar3;
  __node_base_ptr p_Var4;
  __hash_code __code_1;
  long lVar5;
  __hash_code __code;
  char *pcVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  longlong b;
  longlong a;
  _Hash_node_base *local_30;
  _Hash_node_base *local_28;
  
  piVar3 = std::istream::_M_extract<long_long>(&std::cin);
  std::istream::_M_extract<long_long>((longlong *)piVar3);
  if (local_28 != local_30) {
    pp_Var1 = (d->_M_h)._M_buckets;
    uVar2 = (d->_M_h)._M_bucket_count;
    p_Var8 = pp_Var1[(ulong)local_28 % uVar2];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var8->_M_nxt, p_Var9 = p_Var8, local_28 != p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var7, p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar2 != (ulong)local_28 % uVar2) ||
           (p_Var9 = p_Var8, local_28 == p_Var7[1]._M_nxt)) goto LAB_0010137f;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_0010137f:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var9->_M_nxt;
    }
    p_Var8 = pp_Var1[(ulong)local_30 % uVar2];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var10 = p_Var8->_M_nxt, p_Var9 = p_Var8, local_30 != p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var10, p_Var10 = p_Var8->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var10[1]._M_nxt % uVar2 != (ulong)local_30 % uVar2) ||
           (p_Var9 = p_Var8, local_30 == p_Var10[1]._M_nxt)) goto LAB_001013de;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_001013de:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var10 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var10 = p_Var9->_M_nxt;
    }
    if ((p_Var7 != (_Hash_node_base *)0x0) && (p_Var10 != (_Hash_node_base *)0x0)) {
      p_Var11 = (_Hash_node_base *)0x0;
      p_Var4 = std::
               _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&d->_M_h,(ulong)p_Var7[2]._M_nxt % uVar2,(key_type *)(p_Var7 + 2),
                          (__hash_code)p_Var7[2]._M_nxt);
      if (p_Var4 != (__node_base_ptr)0x0) {
        p_Var11 = p_Var4->_M_nxt;
      }
      p_Var7 = (_Hash_node_base *)0x0;
      p_Var4 = std::
               _Hashtable<long_long,_std::pair<const_long_long,_long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&d->_M_h,(ulong)p_Var10[2]._M_nxt % (d->_M_h)._M_bucket_count,
                          (key_type *)(p_Var10 + 2),(__hash_code)p_Var10[2]._M_nxt);
      if (p_Var4 != (__node_base_ptr)0x0) {
        p_Var7 = p_Var4->_M_nxt;
      }
      if (((p_Var11 != (_Hash_node_base *)0x0) && (p_Var7 != (_Hash_node_base *)0x0)) &&
         (p_Var11[2]._M_nxt == p_Var7[2]._M_nxt)) {
        pcVar6 = "YES\n";
        lVar5 = 4;
        goto LAB_00101315;
      }
    }
  }
  pcVar6 = "NO\n";
  lVar5 = 3;
LAB_00101315:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  return;
}

Assistant:

void solve(const unordered_map<long long, long long> &d) {
    auto e = d.end();

    long long a, b;
    cin >> a >> b;
    if (a == b) {
        cout << "NO\n";
        return;
    }
    auto da = d.find(a), db = d.find(b);
    if (da == e || db == e) {
        cout << "NO\n";
        return;
    }

    auto dda = d.find(da->second), ddb = d.find(db->second);
    if (dda == e || ddb == e) {
        cout << "NO\n";
        return;
    }

    if (dda->second == ddb->second) {
        cout << "YES\n";
        return;
    }
    cout << "NO\n";
}